

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int open_gl(void)

{
  uint uVar1;
  uint index;
  uint local_4;
  
  uVar1 = 0;
  while( true ) {
    if (1 < uVar1) {
      return 0;
    }
    libGL = (void *)dlopen(open_gl::NAMES[uVar1],0x102);
    if (libGL != (void *)0x0) break;
    uVar1 = uVar1 + 1;
    libGL = (void *)0x0;
  }
  gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
  local_4 = (uint)(gladGetProcAddressPtr != (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0);
  return local_4;
}

Assistant:

static
int open_gl(void) {
#ifdef __APPLE__
    static const char *NAMES[] = {
        "../Frameworks/OpenGL.framework/OpenGL",
        "/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/OpenGL",
        "/System/Library/Frameworks/OpenGL.framework/Versions/Current/OpenGL"
    };
#else
    static const char *NAMES[] = {"libGL.so.1", "libGL.so"};
#endif

    unsigned int index = 0;
    for(index = 0; index < (sizeof(NAMES) / sizeof(NAMES[0])); index++) {
        libGL = dlopen(NAMES[index], RTLD_NOW | RTLD_GLOBAL);

        if(libGL != NULL) {
#if defined(__APPLE__) || defined(__HAIKU__)
            return 1;
#else
            gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,
                "glXGetProcAddressARB");
            return gladGetProcAddressPtr != NULL;
#endif
        }
    }

    return 0;
}